

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringBuilder.cpp
# Opt level: O0

void __thiscall
Js::JSONStringBuilder::AppendArrayString(JSONStringBuilder *this,JSONArray *valueArray)

{
  uint uVar1;
  uint32 count;
  uint local_2c;
  uint32 i;
  JSONProperty *arr;
  uint32 stepbackLevel;
  uint32 length;
  JSONArray *valueArray_local;
  JSONStringBuilder *this_local;
  
  uVar1 = valueArray->length;
  if (uVar1 == 0) {
    AppendCharacter(this,L'[');
    AppendCharacter(this,L']');
  }
  else {
    count = this->indentLevel;
    this->indentLevel = this->indentLevel + 1;
    AppendCharacter(this,L'[');
    if (this->gap != (char16 *)0x0) {
      AppendCharacter(this,L'\n');
      AppendGap(this,this->indentLevel);
    }
    AppendJSONPropertyString(this,(JSONProperty *)(valueArray + 1));
    for (local_2c = 1; local_2c < uVar1; local_2c = local_2c + 1) {
      if (this->gap == (char16 *)0x0) {
        AppendCharacter(this,L',');
      }
      else {
        AppendCharacter(this,L',');
        AppendCharacter(this,L'\n');
        AppendGap(this,this->indentLevel);
      }
      AppendJSONPropertyString(this,(JSONProperty *)(valueArray + 1) + local_2c);
    }
    if (this->gap != (char16 *)0x0) {
      AppendCharacter(this,L'\n');
      AppendGap(this,count);
    }
    AppendCharacter(this,L']');
    this->indentLevel = count;
  }
  return;
}

Assistant:

void
JSONStringBuilder::AppendArrayString(_In_ JSONArray* valueArray)
{
    uint32 length = valueArray->length;
    if (length == 0)
    {
        this->AppendCharacter(_u('['));
        this->AppendCharacter(_u(']'));
        return;
    }

    const uint32 stepbackLevel = this->indentLevel;
    ++this->indentLevel;

    JSONProperty* arr = valueArray->arr;

    this->AppendCharacter(_u('['));

    if (this->gap != nullptr)
    {
        this->AppendCharacter(_u('\n'));
        this->AppendGap(indentLevel);
    }

    this->AppendJSONPropertyString(&arr[0]);

    for (uint32 i = 1; i < length; ++i)
    {
        if (this->gap == nullptr)
        {
            this->AppendCharacter(_u(','));
        }
        else
        {
            this->AppendCharacter(_u(','));
            this->AppendCharacter(_u('\n'));
            this->AppendGap(indentLevel);
        }
        AppendJSONPropertyString(&arr[i]);
    }

    if (this->gap != nullptr)
    {
        this->AppendCharacter(_u('\n'));
        this->AppendGap(stepbackLevel);
    }
    this->AppendCharacter(_u(']'));

    this->indentLevel = stepbackLevel;
}